

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void RAWToRGBARow_C(uint8_t *src_raw,uint8_t *dst_rgba,int width)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  long lVar4;
  
  if (0 < width) {
    lVar4 = 0;
    do {
      uVar1 = *src_raw;
      uVar2 = src_raw[1];
      uVar3 = src_raw[2];
      dst_rgba[lVar4 * 4] = 0xff;
      dst_rgba[lVar4 * 4 + 1] = uVar3;
      dst_rgba[lVar4 * 4 + 2] = uVar2;
      dst_rgba[lVar4 * 4 + 3] = uVar1;
      src_raw = src_raw + 3;
      lVar4 = lVar4 + 1;
    } while (width != (int)lVar4);
  }
  return;
}

Assistant:

void RAWToRGBARow_C(const uint8_t* src_raw, uint8_t* dst_rgba, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t r = src_raw[0];
    uint8_t g = src_raw[1];
    uint8_t b = src_raw[2];
    dst_rgba[0] = 255u;
    dst_rgba[1] = b;
    dst_rgba[2] = g;
    dst_rgba[3] = r;
    dst_rgba += 4;
    src_raw += 3;
  }
}